

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O3

int Ivy_FastMapNodeAreaDerefed(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
  iVar2 = 0;
  if ((uVar1 != 1) && (iVar2 = 0, uVar1 != 4)) {
    if (uVar1 - 7 < 0xfffffffe) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x42e,"int Ivy_FastMapNodeAreaDerefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    if (*(int *)(*(long *)((long)pAig->pData + 0x10) + 4 +
                (long)*(int *)((long)pAig->pData + 8) * (long)pObj->Id) != 0) {
      __assert_fail("pSupp->nRefs == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x430,"int Ivy_FastMapNodeAreaDerefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    iVar2 = Ivy_FastMapNodeRef(pAig,(Ivy_Obj_t *)(long)pObj->Id);
    iVar3 = Ivy_FastMapNodeDeref(pAig,(Ivy_Obj_t *)(ulong)(uint)pObj->Id);
    if (iVar3 != iVar2) {
      __assert_fail("aResult == aResult2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x433,"int Ivy_FastMapNodeAreaDerefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
  }
  return iVar2;
}

Assistant:

int Ivy_FastMapNodeAreaDerefed( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    Ivy_Supp_t * pSupp;
    int aResult, aResult2;
    if ( Ivy_ObjIsCi(pObj) )
        return 0;
    assert( Ivy_ObjIsNode(pObj) );
    pSupp = Ivy_ObjSupp( pAig, pObj );
    assert( pSupp->nRefs == 0 );
    aResult2 = Ivy_FastMapNodeRef( pAig, pObj );
    aResult  = Ivy_FastMapNodeDeref( pAig, pObj );
    assert( aResult == aResult2 );
    return aResult;
}